

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

float ggml_get_f32_nd(ggml_tensor *tensor,int i0,int i1,int i2,int i3)

{
  float *pfVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined4 *in_RDI;
  int in_R8D;
  void *data;
  float local_4;
  
  pfVar1 = (float *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * *(long *)(in_RDI + 0xc) +
                     (long)in_EDX * *(long *)(in_RDI + 0xe) +
                     (long)in_ECX * *(long *)(in_RDI + 0x10) +
                    (long)in_R8D * *(long *)(in_RDI + 0x12));
  switch(*in_RDI) {
  case 0:
    local_4 = *pfVar1;
    break;
  case 1:
    local_4 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)pfVar1);
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0x46e,"fatal error");
  case 0x18:
    local_4 = (float)(int)*(char *)pfVar1;
    break;
  case 0x19:
    local_4 = (float)(int)(short)*(ggml_fp16_t *)pfVar1;
    break;
  case 0x1a:
    local_4 = (float)(int)*pfVar1;
    break;
  case 0x1e:
    local_4 = ggml_compute_bf16_to_fp32((ggml_bf16_t)*(uint16_t *)pfVar1);
  }
  return local_4;
}

Assistant:

float ggml_get_f32_nd(const struct ggml_tensor * tensor, int i0, int i1, int i2, int i3) {
    void * data   = (char *) tensor->data + i0*tensor->nb[0] + i1*tensor->nb[1] + i2*tensor->nb[2] + i3*tensor->nb[3];
    switch (tensor->type) {
        case GGML_TYPE_I8:
            return ((int8_t *) data)[0];
        case GGML_TYPE_I16:
            return ((int16_t *) data)[0];
        case GGML_TYPE_I32:
            return ((int32_t *) data)[0];
        case GGML_TYPE_F16:
            return GGML_FP16_TO_FP32(((ggml_fp16_t *) data)[0]);
        case GGML_TYPE_BF16:
            return GGML_BF16_TO_FP32(((ggml_bf16_t *) data)[0]);
        case GGML_TYPE_F32:
            return ((float *) data)[0];
        default:
            GGML_ABORT("fatal error");
    }
}